

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O0

void SHA512_Transform(SHA512_CTX *context,sha2_word64 *data)

{
  sha2_word64 sVar1;
  sha2_word64 sVar2;
  sha2_word64 sVar3;
  sha2_word64 sVar4;
  ulong uVar5;
  long lVar6;
  sha2_word64 sVar7;
  sha2_word64 sVar8;
  ulong uVar9;
  ulong uVar10;
  sha2_word64 tmp;
  int j;
  sha2_word64 *W512;
  sha2_word64 T2;
  sha2_word64 T1;
  sha2_word64 s1;
  sha2_word64 s0;
  sha2_word64 h;
  sha2_word64 g;
  sha2_word64 f;
  sha2_word64 e;
  sha2_word64 d;
  sha2_word64 c;
  sha2_word64 b;
  sha2_word64 a;
  sha2_word64 *data_local;
  SHA512_CTX *context_local;
  
  b = context->state[0];
  c = context->state[1];
  d = context->state[2];
  e = context->state[3];
  f = context->state[4];
  g = context->state[5];
  h = context->state[6];
  s0 = context->state[7];
  tmp._4_4_ = 0;
  a = (sha2_word64)data;
  do {
    uVar5 = *(ulong *)a >> 0x20 | *(ulong *)a << 0x20;
    uVar5 = (uVar5 & 0xff00ff00ff00ff00) >> 8 | (uVar5 & 0xff00ff00ff00ff) << 8;
    *(ulong *)(context->buffer + (long)(int)tmp._4_4_ * 8) =
         (uVar5 & 0xffff0000ffff0000) >> 0x10 | (uVar5 & 0xffff0000ffff) << 0x10;
    lVar6 = s0 + ((f >> 0xe | f << 0x32) ^ (f >> 0x12 | f << 0x2e) ^ (f >> 0x29 | f << 0x17)) +
            (f & g ^ (f ^ 0xffffffffffffffff) & h) + K512[(int)tmp._4_4_] +
            *(long *)(context->buffer + (long)(int)tmp._4_4_ * 8);
    uVar5 = b & c;
    uVar9 = b & d;
    uVar10 = c & d;
    s0 = h;
    h = g;
    g = f;
    f = e + lVar6;
    e = d;
    d = c;
    c = b;
    b = lVar6 + ((b >> 0x1c | b << 0x24) ^ (b >> 0x22 | b << 0x1e) ^ (b >> 0x27 | b << 0x19)) +
                (uVar5 ^ uVar9 ^ uVar10);
    tmp._4_4_ = tmp._4_4_ + 1;
    sVar1 = h;
    sVar2 = g;
    sVar7 = f;
    sVar3 = d;
    sVar4 = c;
    sVar8 = b;
    a = a + 8;
  } while ((int)tmp._4_4_ < 0x10);
  do {
    b = sVar8;
    c = sVar4;
    d = sVar3;
    f = sVar7;
    g = sVar2;
    h = sVar1;
    uVar5 = *(ulong *)(context->buffer + (long)(int)(tmp._4_4_ + 1 & 0xf) * 8);
    uVar9 = *(ulong *)(context->buffer + (long)(int)(tmp._4_4_ + 0xe & 0xf) * 8);
    sVar1 = K512[(int)tmp._4_4_];
    lVar6 = ((uVar9 >> 0x13 | uVar9 << 0x2d) ^ (uVar9 >> 0x3d | uVar9 << 3) ^ uVar9 >> 6) +
            *(long *)(context->buffer + (long)(int)(tmp._4_4_ + 9 & 0xf) * 8) +
            ((uVar5 >> 1 | uVar5 << 0x3f) ^ (uVar5 >> 8 | uVar5 << 0x38) ^ uVar5 >> 7) +
            *(long *)(context->buffer + (long)(int)(tmp._4_4_ & 0xf) * 8);
    *(long *)(context->buffer + (long)(int)(tmp._4_4_ & 0xf) * 8) = lVar6;
    lVar6 = s0 + ((f >> 0xe | f << 0x32) ^ (f >> 0x12 | f << 0x2e) ^ (f >> 0x29 | f << 0x17)) +
            (f & g ^ (f ^ 0xffffffffffffffff) & h) + sVar1 + lVar6;
    s0 = h;
    sVar7 = e + lVar6;
    e = d;
    sVar8 = lVar6 + ((b >> 0x1c | b << 0x24) ^ (b >> 0x22 | b << 0x1e) ^ (b >> 0x27 | b << 0x19)) +
                    (b & c ^ b & d ^ c & d);
    tmp._4_4_ = tmp._4_4_ + 1;
    sVar1 = g;
    sVar2 = f;
    sVar3 = c;
    sVar4 = b;
  } while ((int)tmp._4_4_ < 0x50);
  context->state[0] = sVar8 + context->state[0];
  context->state[1] = b + context->state[1];
  context->state[2] = c + context->state[2];
  context->state[3] = d + context->state[3];
  context->state[4] = sVar7 + context->state[4];
  context->state[5] = f + context->state[5];
  context->state[6] = g + context->state[6];
  context->state[7] = h + context->state[7];
  return;
}

Assistant:

void SHA512_Transform(SHA512_CTX* context, const sha2_word64* data) {
	sha2_word64	a, b, c, d, e, f, g, h, s0, s1;
	sha2_word64	T1, T2, *W512 = (sha2_word64*)context->buffer;
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = context->state[0];
	b = context->state[1];
	c = context->state[2];
	d = context->state[3];
	e = context->state[4];
	f = context->state[5];
	g = context->state[6];
	h = context->state[7];

	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		REVERSE64(*data++, W512[j]);
		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + W512[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		/* Apply the SHA-512 compression function to update a..h with copy */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + (W512[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W512[(j+1)&0x0f];
		s0 = sigma0_512(s0);
		s1 = W512[(j+14)&0x0f];
		s1 =  sigma1_512(s1);

		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] +
		     (W512[j&0x0f] += s1 + W512[(j+9)&0x0f] + s0);
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 80);

	/* Compute the current intermediate hash value */
	context->state[0] += a;
	context->state[1] += b;
	context->state[2] += c;
	context->state[3] += d;
	context->state[4] += e;
	context->state[5] += f;
	context->state[6] += g;
	context->state[7] += h;
}